

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classic.cpp
# Opt level: O0

bool __thiscall ClassicMapGenerator::generate(ClassicMapGenerator *this)

{
  coord cVar1;
  int iVar2;
  undefined1 local_28 [8];
  Area area;
  int n;
  ClassicMapGenerator *this_local;
  
  unique0x1000016f = this;
  do_rooms(this);
  for (area.size.y = 0; area.size.y < 9; area.size.y = area.size.y + 1) {
    if ((this->rooms[area.size.y].r_flags & 2U) == 0) {
      Area::Area((Area *)local_28);
      cVar1 = this->rooms[area.size.y].r_pos;
      local_28._0_4_ = cVar1.x;
      local_28._4_4_ = cVar1.y;
      local_28._4_4_ = local_28._4_4_ + 1;
      local_28._0_4_ = local_28._0_4_ + 1;
      cVar1 = this->rooms[area.size.y].r_max;
      area.position.x = cVar1.x;
      area.position.y = cVar1.y;
      area.position.y = area.position.y + -2;
      area.position.x = area.position.x + -2;
      std::vector<Area,_std::allocator<Area>_>::push_back(&areas,(value_type *)local_28);
    }
  }
  do_passages(this);
  if ((((amulet & 1U) == 0) && (level == max_level)) && (iVar2 = rnd(0x14), iVar2 == 0)) {
    treas_room(this);
  }
  placeRandomItems();
  placeAmuletIfRequired();
  placeRandomTraps();
  placeRandomStairs();
  placeRandomHero();
  return true;
}

Assistant:

bool ClassicMapGenerator::generate()
{
    do_rooms();     /* Draw rooms */
    //Build the area definitions from the room definitions.
    for(int n=0; n<MAXROOMS; n++)
    {
        if (rooms[n].r_flags & ISGONE)
            continue;
        Area area;
        area.position = rooms[n].r_pos;
        area.position.x += 1;
        area.position.y += 1;
        area.size = rooms[n].r_max;
        area.size.x -= 2;
        area.size.y -= 2;
        areas.push_back(area);
    }
    do_passages();  /* Draw passages */

    /*
     * check for treasure rooms, and if so, put it in.
     */
    if (!amulet && level == max_level && rnd(TREAS_ROOM) == 0)
        treas_room();

    placeRandomItems();
    placeAmuletIfRequired();
    placeRandomTraps();
    placeRandomStairs();
    placeRandomHero();
    
    return true;
}